

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::traverseElementDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel)

{
  uint uVar1;
  ComplexTypeInfo *this_00;
  XercesGroupInfo *this_01;
  XSAnnotation *pXVar2;
  bool bVar3;
  bool bVar4;
  unsigned_short elemContext;
  int iVar5;
  XMLCh *pXVar6;
  SchemaElementDecl *this_02;
  XMLSize_t count;
  undefined4 extraout_var;
  DOMElement *pDVar7;
  DOMNode *pDVar8;
  XSAnnotation *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  SchemaAttDef *this_04;
  DatatypeValidator *isDuplicate_00;
  undefined7 in_register_00000011;
  bool isDuplicate;
  XSAnnotation *local_78;
  DOMNode *local_70;
  SchemaInfo *local_68;
  DatatypeValidator *local_60;
  bool local_51;
  ComplexTypeInfo *typeInfo;
  XMLCh *valueConstraint;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  if (((int)CONCAT71(in_register_00000011,topLevel) == 0) &&
     (pXVar6 = getElementAttValue(this,elem,L"ref",QName), pXVar6 != (XMLCh *)0x0)) {
    this_02 = processElementDeclRef(this,elem,pXVar6);
    goto LAB_00312897;
  }
  pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((pXVar6 == (XMLCh *)0x0) || (*pXVar6 == L'\0')) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x11);
  }
  else {
    count = XMLString::stringLen(pXVar6);
    bVar3 = XMLChar1_0::isValidNCName(pXVar6,count);
    if (bVar3) {
      elemContext = 0x10;
      if (topLevel) {
        iVar5 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb]
                )(this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,pXVar6,0,0xfffffffffffffffe);
        this_02 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar5);
        if (this_02 != (SchemaElementDecl *)0x0) goto LAB_00312897;
        elemContext = 0xf;
      }
      GeneralAttributeCheck::checkAttributes
                (&this->fAttributeCheck,elem,elemContext,this,topLevel,this->fNonXSAttList);
      pDVar7 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      pDVar8 = &checkContent(this,elem,pDVar7,true,true)->super_DOMNode;
      local_78 = this->fAnnotation;
      if (local_78 == (XSAnnotation *)0x0) {
        if (this->fScanner->fGenerateSyntheticAnnotations == true) {
          local_78 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
          this->fAnnotation = local_78;
        }
        else {
          local_78 = (XSAnnotation *)0x0;
        }
      }
      isDuplicate_00 = (DatatypeValidator *)&isDuplicate;
      isDuplicate = false;
      valueConstraint = (XMLCh *)0x0;
      this_02 = createSchemaElementDecl
                          (this,elem,pXVar6,(bool *)isDuplicate_00,&valueConstraint,topLevel);
      local_68 = (SchemaInfo *)CONCAT71(local_68._1_7_,isDuplicate);
      if (isDuplicate == false) {
        (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                  (this->fSchemaGrammar,this_02,0);
        if (valueConstraint != (XMLCh *)0x0) {
          SchemaElementDecl::setDefaultValue(this_02,valueConstraint);
        }
        pXVar2 = local_78;
        if (local_78 != (XSAnnotation *)0x0) {
          local_78 = (XSAnnotation *)0x0;
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_02,pXVar2);
        }
        this_00 = this->fCurrentComplexType;
        if ((this_00 != (ComplexTypeInfo *)0x0) &&
           (this_02->fEnclosingScope == this_00->fScopeDefined)) {
          local_78 = (XSAnnotation *)0x0;
          ComplexTypeInfo::addElement(this_00,this_02);
          this_02->fPSVIScope = SCP_LOCAL;
        }
        this_01 = this->fCurrentGroupInfo;
        if ((this_01 != (XercesGroupInfo *)0x0) && (this_02->fEnclosingScope == this_01->fScope)) {
          local_78 = (XSAnnotation *)0x0;
          XercesGroupInfo::addElement(this_01,this_02);
          this_02->fPSVIScope = SCP_ABSENT;
        }
        local_78 = (XSAnnotation *)0x0;
      }
      else if (this->fAnnotation != (XSAnnotation *)0x0) {
        this_03 = SchemaGrammar::getAnnotation(this->fSchemaGrammar,this_02);
        pXVar2 = local_78;
        if (this_03 == (XSAnnotation *)0x0) {
          local_78 = (XSAnnotation *)0x0;
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_02,pXVar2);
        }
        else {
          local_78 = (XSAnnotation *)0x0;
          XSAnnotation::setNext(this_03,pXVar2);
        }
      }
      typeInfo = (ComplexTypeInfo *)0x0;
      local_60 = (DatatypeValidator *)0x0;
      if (pDVar8 == (DOMNode *)0x0) {
        local_68 = (SchemaInfo *)((ulong)local_68 & 0xffffffff00000000);
      }
      else {
        local_70 = pDVar8;
        iVar5 = (*((DOMNode *)&pDVar8->_vptr_DOMNode)->_vptr_DOMNode[0x18])(pDVar8);
        bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar5),
                                  (XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE);
        if (bVar3) {
          iVar5 = (*((DOMNode *)&local_70->_vptr_DOMNode)->_vptr_DOMNode[0x29])
                            (local_70,SchemaSymbols::fgATT_NAME);
          if (((short *)CONCAT44(extraout_var_01,iVar5) == (short *)0x0) ||
             (*(short *)CONCAT44(extraout_var_01,iVar5) == 0)) {
            typeInfo = checkForComplexTypeInfo(this,(DOMElement *)local_70);
            if (typeInfo != (ComplexTypeInfo *)0x0) {
              isDuplicate_00 = typeInfo->fDatatypeValidator;
              local_60 = isDuplicate_00;
              if (((char)local_68 == '\0') && (typeInfo->fPreprocessed == true)) {
                pXVar9 = typeInfo->fTypeName;
                local_68 = this->fSchemaInfo;
                iVar5 = XMLString::indexOf(pXVar9,L',');
                SchemaInfo::addRecursingType
                          (local_68,(DOMElement *)local_70,pXVar9 + (long)iVar5 + 1);
              }
            }
          }
          else {
            isDuplicate_00 = (DatatypeValidator *)0x0;
            reportSchemaError(this,(DOMElement *)local_70,(XMLCh *)XMLUni::fgXMLErrDomain,0x14,
                              pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          local_70 = &XUtil::getNextSiblingElement(local_70)->super_DOMNode;
LAB_00312b86:
          local_68 = (SchemaInfo *)
                     CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)isDuplicate_00 >> 8),1));
          if (local_70 == (DOMNode *)0x0) goto LAB_00312bbd;
        }
        else {
          bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar5),
                                    (XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE);
          pDVar8 = local_70;
          if (bVar3) {
            iVar5 = (*local_70->_vptr_DOMNode[0x29])(local_70,SchemaSymbols::fgATT_NAME);
            if (((short *)CONCAT44(extraout_var_02,iVar5) == (short *)0x0) ||
               (*(short *)CONCAT44(extraout_var_02,iVar5) == 0)) {
              local_60 = checkForSimpleTypeValidator(this,(DOMElement *)pDVar8,0);
            }
            else {
              isDuplicate_00 = (DatatypeValidator *)0x0;
              reportSchemaError(this,(DOMElement *)pDVar8,(XMLCh *)XMLUni::fgXMLErrDomain,0x15,
                                pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            local_70 = &XUtil::getNextSiblingElement(pDVar8)->super_DOMNode;
            goto LAB_00312b86;
          }
          local_68 = (SchemaInfo *)((ulong)local_68 & 0xffffffff00000000);
        }
        pDVar7 = checkIdentityConstraintContent(this,(DOMElement *)local_70);
        if (pDVar7 != (DOMElement *)0x0) {
          reportSchemaError(this,pDVar7,(XMLCh *)XMLUni::fgXMLErrDomain,0x16);
        }
      }
LAB_00312bbd:
      pXVar9 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
      if (pXVar9 != (XMLCh *)0x0) {
        if ((char)local_68 == '\0') {
          if (*pXVar9 != L'\0') {
            local_70 = (DOMNode *)getLocalPart(this,pXVar9);
            pXVar10 = getPrefix(this,pXVar9);
            pXVar10 = resolvePrefixToURI(this,elem,pXVar10);
            bVar3 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            if ((!bVar3) ||
               (bVar3 = XMLString::equals((XMLCh *)local_70,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE
                                         ), !bVar3)) {
              checkEnumerationRequiredNotation(this,elem,pXVar6,pXVar9);
              local_70 = (DOMNode *)checkTypeFromAnotherSchema(this,elem,pXVar9);
              typeInfo = getElementComplexTypeInfo(this,elem,pXVar9,(XMLCh *)local_70);
              if (typeInfo == (ComplexTypeInfo *)0x0) {
                local_60 = getElementTypeValidator(this,elem,pXVar9,&local_51,(XMLCh *)local_70);
              }
              else {
                local_60 = typeInfo->fDatatypeValidator;
              }
            }
          }
        }
        else {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x36,pXVar6,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      bVar3 = isDuplicate;
      if (isDuplicate == true) {
        if ((this_02->fComplexTypeInfo != typeInfo) || (this_02->fDatatypeValidator != local_60)) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,pXVar6,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else {
        this_02->fDatatypeValidator = local_60;
        this_02->fComplexTypeInfo = typeInfo;
        if (local_60 == (DatatypeValidator *)0x0) {
          if (typeInfo != (ComplexTypeInfo *)0x0) {
            iVar5 = typeInfo->fContentType;
            goto LAB_00312d3e;
          }
        }
        else {
          iVar5 = 5;
LAB_00312d3e:
          *(int *)&(this_02->super_XMLElementDecl).field_0x2c = iVar5;
        }
        if (((topLevel) &&
            (pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SUBSTITUTIONGROUP,
                                         QName), pXVar6 != (XMLCh *)0x0)) && (*pXVar6 != L'\0')) {
          processSubstitutionGroup(this,elem,this_02,&typeInfo,&local_60,pXVar6);
        }
        pDVar7 = XUtil::getFirstChildElementNS
                           (&elem->super_DOMNode,(XMLCh **)fgIdentityConstraints,
                            (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,3);
        if (pDVar7 != (DOMElement *)0x0) {
          processElemDeclIC(this,pDVar7,this_02);
        }
      }
      if (typeInfo == (ComplexTypeInfo *)0x0 && local_60 == (DatatypeValidator *)0x0) {
        if (bVar3 == false) {
          *(undefined4 *)&(this_02->super_XMLElementDecl).field_0x2c = 1;
          this_04 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef
                    (this_04,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                     this->fGrammarPoolMemoryManager);
          if (this_02->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(this_02->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])()
            ;
          }
          this_02->fAttWildCard = this_04;
        }
      }
      else if ((valueConstraint != (XMLCh *)0x0) &&
              (bVar4 = checkElemDeclValueConstraint
                                 (this,elem,this_02,valueConstraint,typeInfo,local_60),
              !bVar4 && bVar3 == false)) {
        uVar1 = this_02->fMiscFlags;
        SchemaElementDecl::setDefaultValue(this_02,(XMLCh *)0x0);
        this_02->fMiscFlags = uVar1 & 0xfffffffb;
      }
      if (local_78 != (XSAnnotation *)0x0) {
        (*(local_78->super_XSerializable)._vptr_XSerializable[1])();
      }
      goto LAB_00312897;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                      (XMLCh *)SchemaSymbols::fgELT_ELEMENT,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  this_02 = (SchemaElementDecl *)0x0;
LAB_00312897:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return this_02;
}

Assistant:

SchemaElementDecl*
TraverseSchema::traverseElementDecl(const DOMElement* const elem,
                                    const bool topLevel)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // if local element and ref attribute exists
    if (!topLevel)
    {
        const XMLCh* refName = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
        if (refName)
            return processElementDeclRef(elem, refName);
    }

    // check for empty name
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    if (!name || !*name)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefElement);
        return 0;
    }

    // make sure that name is a valid NCName
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)))
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain,
            XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ELEMENT, name);
        return 0;
    }

    // if element already exists, just return --- revisit, it should not happen
    if (topLevel)
    {
        SchemaElementDecl* retDecl = (SchemaElementDecl*) fSchemaGrammar->getElemDecl(fTargetNSURI, name, 0, Grammar::TOP_LEVEL_SCOPE);
        if (retDecl)
            return retDecl;
    }

    // Check attributes
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_ElementGlobal
                                      : GeneralAttributeCheck::E_ElementLocal;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // check annotation
    const DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    // Put annotations on all elements for the situation where there is a group of
    // elements and not all have annotations.
    //if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    if (!fAnnotation && fScanner->getGenerateSyntheticAnnotations())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // Create element decl
    bool isDuplicate = false;
    const XMLCh* valueConstraint = 0;
    SchemaElementDecl* elemDecl =
        createSchemaElementDecl(elem, name, isDuplicate, valueConstraint, topLevel);

    if (!isDuplicate) {

        fSchemaGrammar->putElemDecl(elemDecl);

        if (valueConstraint)
            elemDecl->setDefaultValue(valueConstraint);

        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());

        if (fCurrentComplexType &&
            elemDecl->getEnclosingScope() == fCurrentComplexType->getScopeDefined()) {
            fCurrentComplexType->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentGroupInfo &&
            elemDecl->getEnclosingScope() == fCurrentGroupInfo->getScope()) {
            fCurrentGroupInfo->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_ABSENT);
        }
    }
    else {
        if (fAnnotation) {
            XSAnnotation* xsAnnot = fSchemaGrammar->getAnnotation(elemDecl);
            if (!xsAnnot) {
                fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());
            }
            else {
                xsAnnot->setNext(janAnnot.release());
            }
        }
    }

    // Process children
    bool               anonymousType = false;
    ComplexTypeInfo*   typeInfo = 0;
    DatatypeValidator* validator = 0;

    if (content != 0)
    {
        const XMLCh* contentName = content->getLocalName();

        if (XMLString::equals(contentName, SchemaSymbols::fgELT_COMPLEXTYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);

            if (temp && *temp)
            {
                // REVISIT - we are bypassing the complex type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonComplexTypeWithName, name);
            }
            else
            {
                typeInfo = checkForComplexTypeInfo(content);

                if (typeInfo)
                {
                    validator = typeInfo->getDatatypeValidator();

                    if (!isDuplicate) {

                        //Recursing element
                        if (typeInfo->getPreprocessed()) {

                            const XMLCh* typeInfoName = typeInfo->getTypeName();
                            fSchemaInfo->addRecursingType(content, typeInfoName + XMLString::indexOf(typeInfoName, chComma) + 1);
                        }
                    }
                }
            }

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }
        else if (XMLString::equals(contentName, SchemaSymbols::fgELT_SIMPLETYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);
            if (temp && *temp)
                // REVISIT - we are bypassing the simple type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonSimpleTypeWithName, name);
            else
                validator = checkForSimpleTypeValidator(content);

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }

        // Check for identity constraints
        if (content != 0)
        {
            content = checkIdentityConstraintContent(content);
            if (content != 0)
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::InvalidElementContent);
        }
    }

    // Handle 'type' attribute
    const XMLCh* typeStr = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    if (typeStr)
    {
        if (anonymousType)
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::ElementWithTypeAndAnonType, name);
        }
        else if (*typeStr)
        {
            const XMLCh* typeLocalPart = getLocalPart(typeStr);
            const XMLCh* typePrefix = getPrefix(typeStr);
            const XMLCh* typeURI = resolvePrefixToURI(elem, typePrefix);

            if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
                || !XMLString::equals(typeLocalPart, SchemaSymbols::fgATTVAL_ANYTYPE))
            {
                checkEnumerationRequiredNotation(elem, name, typeStr);

                bool noErrorFound = true;
                const XMLCh* anotherSchemaURI = checkTypeFromAnotherSchema(elem, typeStr);

                // get complex type info
                typeInfo = getElementComplexTypeInfo(elem, typeStr, anotherSchemaURI);

                // get simple type validtor - if not a complex type
                if (typeInfo)
                    validator = typeInfo->getDatatypeValidator();
                else
                    validator = getElementTypeValidator(elem, typeStr, noErrorFound, anotherSchemaURI);
            }
        }
    }

    // check for duplicate elements with different types.
    if (isDuplicate)
    {
        DatatypeValidator* eltDV = elemDecl->getDatatypeValidator();
        ComplexTypeInfo*   eltTypeInfo = elemDecl->getComplexTypeInfo();

        if ( (eltTypeInfo != typeInfo) || (eltDV != validator))  {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, name);
        }
    }
    // Set element declararion type information
    else
    {
        elemDecl->setDatatypeValidator(validator);
        elemDecl->setComplexTypeInfo(typeInfo);

        if (validator)
            elemDecl->setModelType(SchemaElementDecl::Simple);
        else if (typeInfo)
            elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());

        if (topLevel) {

            // Handle the substitutionGroup
            const XMLCh* subsGroupName = getElementAttValue(elem, SchemaSymbols::fgATT_SUBSTITUTIONGROUP, DatatypeValidator::QName);
            if (subsGroupName && *subsGroupName)
                 processSubstitutionGroup(elem, elemDecl, typeInfo, validator, subsGroupName);
        }

        // process identity constraints
        DOMElement* ic = XUtil::getFirstChildElementNS(
            elem, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);

        if (ic)
            processElemDeclIC(ic, elemDecl);
    }

    if (!typeInfo && !validator)
    {
        if (!isDuplicate)
        {
            elemDecl->setModelType(SchemaElementDecl::Any);
            elemDecl->setAttWildCard(
                new (fGrammarPoolMemoryManager) SchemaAttDef(
                    XMLUni::fgZeroLenString, XMLUni::fgZeroLenString,
                    fEmptyNamespaceURI, XMLAttDef::Any_Any,
                    XMLAttDef::ProcessContents_Lax, fGrammarPoolMemoryManager
                )
            );
        }
    }
    else if (valueConstraint)
    {
        if (!checkElemDeclValueConstraint(elem, elemDecl, valueConstraint, typeInfo, validator)
            && !isDuplicate)
        {
            int miscFlags = elemDecl->getMiscFlags();
            miscFlags &= ~ SchemaSymbols::XSD_FIXED;
            elemDecl->setDefaultValue(0);
            elemDecl->setMiscFlags(miscFlags);
        }
    }

    return elemDecl;
}